

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.hpp
# Opt level: O2

void __thiscall diy::Direction::Direction(Direction *this,int dim,int dir)

{
  int *piVar1;
  
  DynamicPoint<int,_4UL>::DynamicPoint(&this->super_DynamicPoint<int,_4UL>,(long)dim,0);
  if ((dir & 1U) != 0 && 0 < dim) {
    piVar1 = (this->super_DynamicPoint<int,_4UL>).
             super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin;
    *piVar1 = *piVar1 + -1;
  }
  if ((dir & 2U) != 0 && 0 < dim) {
    piVar1 = (this->super_DynamicPoint<int,_4UL>).
             super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin;
    *piVar1 = *piVar1 + 1;
  }
  if ((dir & 4U) != 0 && 1 < dim) {
    piVar1 = (this->super_DynamicPoint<int,_4UL>).
             super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin + 1;
    *piVar1 = *piVar1 + -1;
  }
  if ((dir & 8U) != 0 && 1 < dim) {
    piVar1 = (this->super_DynamicPoint<int,_4UL>).
             super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin + 1;
    *piVar1 = *piVar1 + 1;
  }
  if ((dir & 0x10U) != 0 && 2 < dim) {
    piVar1 = (this->super_DynamicPoint<int,_4UL>).
             super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin + 2;
    *piVar1 = *piVar1 + -1;
  }
  if ((dir & 0x20U) != 0 && 2 < dim) {
    piVar1 = (this->super_DynamicPoint<int,_4UL>).
             super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin + 2;
    *piVar1 = *piVar1 + 1;
  }
  if ((dir & 0x40U) != 0 && 3 < dim) {
    piVar1 = (this->super_DynamicPoint<int,_4UL>).
             super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin + 3;
    *piVar1 = *piVar1 + -1;
  }
  if ((char)dir < '\0' && 3 < dim) {
    piVar1 = (this->super_DynamicPoint<int,_4UL>).
             super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin + 3;
    *piVar1 = *piVar1 + 1;
  }
  return;
}

Assistant:

Direction(int dim, int dir):
                  Parent(dim)
      {
          if (dim > 0 && dir & DIY_X0) (*this)[0] -= 1;
          if (dim > 0 && dir & DIY_X1) (*this)[0] += 1;
          if (dim > 1 && dir & DIY_Y0) (*this)[1] -= 1;
          if (dim > 1 && dir & DIY_Y1) (*this)[1] += 1;
          if (dim > 2 && dir & DIY_Z0) (*this)[2] -= 1;
          if (dim > 2 && dir & DIY_Z1) (*this)[2] += 1;
          if (dim > 3 && dir & DIY_T0) (*this)[3] -= 1;
          if (dim > 3 && dir & DIY_T1) (*this)[3] += 1;
      }